

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O1

double __thiscall Solution::total_weight(Solution *this)

{
  Solution *pSVar1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  for (pSVar1 = (Solution *)
                (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pSVar1 != this;
      pSVar1 = (Solution *)
               (pSVar1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    dVar3 = Vehicle::get_weight((Vehicle *)
                                (pSVar1->vehicles).
                                super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                                _M_node._M_size);
    dVar2 = dVar2 + dVar3;
  }
  this->weight = dVar2;
  return dVar2;
}

Assistant:

double Solution::total_weight() {
    double ret = 0;
    for (auto vehicle: vehicles) {
        ret += vehicle->get_weight();
    }
    weight = ret;
    return ret;
}